

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

double soplex::MPSgetRHS<double>(double left,double right)

{
  double dVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  ::soplex::infinity::__tls_init();
  dVar1 = *(double *)(in_FS_OFFSET + -8);
  if ((left <= -dVar1) && (::soplex::infinity::__tls_init(), left = right, dVar1 <= right)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"XMPSWR01 This should never happen.","");
    *puVar2 = &PTR__SPxException_006a9ee8;
    puVar2[1] = puVar2 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_40,local_40 + local_38);
    *puVar2 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar2,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  return left;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}